

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void close_state(lua_State *L)

{
  global_State *pgVar1;
  long lVar2;
  
  pgVar1 = L->l_G;
  if (((pgVar1->nilvalue).tt_ & 0xf) == 0) {
    L->ci = &L->base_ci;
    lVar2 = (L->stack).offset;
    (L->base_ci).func.offset = lVar2;
    *(undefined1 *)(lVar2 + 8) = 0;
    (L->base_ci).top.p = (StkId)((L->base_ci).func.offset + 0x150);
    (L->base_ci).u.l.savedpc = (Instruction *)0x0;
    (L->base_ci).callstatus = 0x8000;
    L->status = '\0';
    L->errfunc = 0;
    luaD_closeprotected(L,1,'\0');
    (L->top).p = (StkId)((L->stack).offset + 0x10);
  }
  luaC_freeallobjects(L);
  luaM_free_(L,(L->l_G->strt).hash,(long)(L->l_G->strt).size << 3);
  freestack(L);
  (*pgVar1->frealloc)(pgVar1->ud,pgVar1,0x658,0);
  return;
}

Assistant:

static void close_state (lua_State *L) {
  global_State *g = G(L);
  if (!completestate(g))  /* closing a partially built state? */
    luaC_freeallobjects(L);  /* just collect its objects */
  else {  /* closing a fully built state */
    resetCI(L);
    luaD_closeprotected(L, 1, LUA_OK);  /* close all upvalues */
    L->top.p = L->stack.p + 1;  /* empty the stack to run finalizers */
    luaC_freeallobjects(L);  /* collect all objects */
    luai_userstateclose(L);
  }
  luaM_freearray(L, G(L)->strt.hash, cast_sizet(G(L)->strt.size));
  freestack(L);
  lua_assert(gettotalbytes(g) == sizeof(global_State));
  (*g->frealloc)(g->ud, g, sizeof(global_State), 0);  /* free main block */
}